

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Cost.cpp
# Opt level: O2

bool __thiscall
iDynTree::optimalcontrol::Cost::costFirstPartialDerivativeWRTState
          (Cost *this,double param_1,VectorDynSize *param_2,VectorDynSize *param_3,
          VectorDynSize *param_4)

{
  ostream *poVar1;
  ostringstream errorMsg;
  char *local_1a8 [4];
  ostringstream local_188 [376];
  
  std::__cxx11::ostringstream::ostringstream(local_188);
  poVar1 = std::operator<<((ostream *)local_188,"Method not implemented for cost ");
  poVar1 = std::operator<<(poVar1,(string *)&this->m_costName);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::__cxx11::stringbuf::str();
  iDynTree::reportError("Cost","costFirstPartialDerivativeWRTState",local_1a8[0]);
  std::__cxx11::string::~string((string *)local_1a8);
  std::__cxx11::ostringstream::~ostringstream(local_188);
  return false;
}

Assistant:

bool Cost::costFirstPartialDerivativeWRTState(double /*time*/, const VectorDynSize &/*state*/, const VectorDynSize &/*control*/, VectorDynSize &/*partialDerivative*/)
        {
            std::ostringstream errorMsg;
            errorMsg << "Method not implemented for cost "<< name() << std::endl;
            reportError("Cost", "costFirstPartialDerivativeWRTState", errorMsg.str().c_str());
            return false;
        }